

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llog_message.cpp
# Opt level: O0

void __thiscall
ins::LLogMessage::LLogMessage(LLogMessage *this,string *file,string *function,int line,int level)

{
  tm *__tp;
  ostream *poVar1;
  basic_ostream<char,_std::char_traits<char>_> *pbVar2;
  rep rVar3;
  undefined1 local_e0 [32];
  duration<long,_std::ratio<1L,_1000L>_> local_c0;
  native_handle_type local_b8;
  id local_b0;
  id id;
  char time_str [64];
  tm *local_time;
  time_t local_50;
  time_t now_c;
  type log_time_ms;
  time_point now;
  int level_local;
  int line_local;
  string *function_local;
  string *file_local;
  LLogMessage *this_local;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  this->fatal_ = false;
  (anonymous_namespace)::Ignore<std::__cxx11::string_const&>(function);
  log_time_ms.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  now_c = (time_t)std::chrono::
                  time_point_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                            ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                              *)&log_time_ms);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
  ::time_point<std::chrono::duration<long,std::ratio<1l,1000l>>,void>
            ((time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              *)&local_time,
             (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
              *)&now_c);
  local_50 = std::chrono::_V2::system_clock::to_time_t((time_point *)&local_time);
  __tp = localtime(&local_50);
  strftime((char *)&id,0x40,"%m-%d %T",__tp);
  local_b0 = std::this_thread::get_id();
  poVar1 = std::operator<<((ostream *)this,'[');
  local_b8 = local_b0._M_thread;
  pbVar2 = std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)poVar1,local_b0);
  std::operator<<((ostream *)pbVar2,']');
  poVar1 = std::operator<<((ostream *)this,'[');
  std::operator<<(poVar1,LLogMessage::level_description[level]);
  poVar1 = std::operator<<((ostream *)this,' ');
  poVar1 = std::operator<<(poVar1,(char *)&id);
  poVar1 = std::operator<<(poVar1,'.');
  local_c0.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000L>_>_>
                                          *)&now_c);
  rVar3 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_c0);
  std::ostream::operator<<(poVar1,rVar3 % 1000);
  poVar1 = std::operator<<((ostream *)this,' ');
  ParseFileName((LLogMessage *)local_e0,(string *)this);
  std::operator<<(poVar1,(string *)local_e0);
  std::__cxx11::string::~string((string *)local_e0);
  poVar1 = std::operator<<((ostream *)this,':');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  std::operator<<(poVar1,']');
  return;
}

Assistant:

LLogMessage::LLogMessage(const std::string &file,
                         const std::string &function,
                         int line,
                         int level) {
  Ignore(function);
  static const char *level_description[] = {
    "VERBOSE",
    "INFO",
    "WARNING",
    "ERROR",
  };
  auto now = std::chrono::system_clock::now();
  auto log_time_ms = std::chrono::time_point_cast<std::chrono::milliseconds>(now);
  auto now_c = std::chrono::system_clock::to_time_t(log_time_ms);
  auto local_time = std::localtime(&now_c);
  char time_str[64];
  strftime(time_str, sizeof(time_str), "%m-%d %T", local_time);
  auto id = std::this_thread::get_id();
  oss_ << '[' << id << ']';
  oss_ << '[' << level_description[level];
  oss_ << ' ' << time_str << '.' << log_time_ms.time_since_epoch().count() % 1000;
  oss_ << ' ' << ParseFileName(file);
  oss_ << ':' << line << ']';
}